

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

bool ON_IsKnotVectorUniform(int order,int cv_count,double *knot)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  bVar2 = false;
  if (((order <= cv_count) && (1 < order)) && (knot != (double *)0x0)) {
    dVar6 = knot[(ulong)(uint)order - 2];
    dVar5 = knot[(ulong)(uint)order - 1] - dVar6;
    bVar2 = false;
    if (((dVar5 < 1.23432101234321e+308) && ((bVar2 = false, dVar5 != 0.0 || (NAN(dVar5))))) &&
       (-1.23432101234321e+308 < dVar5)) {
      uVar4 = (ulong)(uint)order;
      if (*knot != dVar6) {
        uVar4 = 1;
      }
      if (NAN(*knot) || NAN(dVar6)) {
        uVar4 = 1;
      }
      bVar2 = ON_IsKnotVectorClamped(order,cv_count,knot,1);
      iVar3 = 0;
      if (!bVar2) {
        iVar3 = order + -2;
      }
      bVar2 = true;
      dVar6 = knot[uVar4 - 1];
      while (((long)uVar4 < (long)(iVar3 + cv_count) && (bVar2))) {
        pdVar1 = knot + uVar4;
        bVar2 = ABS((*pdVar1 - dVar6) - dVar5) <= ABS(dVar5 * 1.490116119385e-08);
        uVar4 = uVar4 + 1;
        dVar6 = *pdVar1;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_IsKnotVectorUniform(
          int order,
          int cv_count,
          const double* knot 
          )
{
  bool rc = (order >= 2 && cv_count >= order && 0 != knot);
  if (rc)
  {
    const double delta = knot[order-1] - knot[order-2];
    rc = (0.0 != delta && delta > ON_UNSET_VALUE && delta < ON_UNSET_POSITIVE_VALUE);
    if (rc)
    {
      const int i0 = ON_IsKnotVectorClamped(order, cv_count, knot, 0) ? order : 1;
      const int i1 = ON_IsKnotVectorClamped(order, cv_count, knot, 1) ? cv_count : ON_KnotCount(order, cv_count);
      double k0 = knot[i0 - 1];
      const double delta_tol = fabs(ON_SQRT_EPSILON*delta);
      for (int i = i0; i < i1 && rc; ++i)
      {
        const double d = knot[i] - k0;
        rc = fabs(d - delta) <= delta_tol;
        k0 = knot[i];
      }
    }
  }
  return rc;
}